

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O1

exr_result_t unpack_16bit_4chan_planar(exr_decode_pipeline_t *decode)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  exr_coding_channel_info_t *peVar5;
  size_t __n;
  long lVar6;
  uint8_t *__dest;
  int iVar7;
  void *__src;
  uint8_t *__dest_00;
  uint8_t *__dest_01;
  uint8_t *__dest_02;
  
  iVar7 = (decode->chunk).height;
  if (0 < iVar7) {
    peVar5 = decode->channels;
    __dest = peVar5[3].field_12.decode_to_ptr;
    __dest_01 = peVar5[2].field_12.decode_to_ptr;
    __dest_02 = (peVar5->field_12).decode_to_ptr;
    __dest_00 = peVar5[1].field_12.decode_to_ptr;
    iVar1 = peVar5[3].user_line_stride;
    iVar2 = peVar5[2].user_line_stride;
    iVar3 = peVar5[1].user_line_stride;
    iVar4 = peVar5->user_line_stride;
    lVar6 = (long)peVar5->width;
    __n = lVar6 * 2;
    __src = decode->unpacked_buffer;
    do {
      memcpy(__dest_02,__src,__n);
      memcpy(__dest_00,(void *)((long)__src + __n),__n);
      memcpy(__dest_01,(void *)(lVar6 * 4 + (long)__src),__n);
      memcpy(__dest,(void *)(lVar6 * 6 + (long)__src),__n);
      __dest_02 = __dest_02 + iVar4;
      __dest_00 = __dest_00 + iVar3;
      __dest_01 = __dest_01 + iVar2;
      __dest = __dest + iVar1;
      iVar7 = iVar7 + -1;
      __src = (void *)(lVar6 * 8 + (long)__src);
    } while (iVar7 != 0);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_16bit_4chan_planar (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = (const uint8_t*) decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2, *in3;
    uint8_t *       out0, *out1, *out2, *out3;
    int             w, h;
    int             linc0, linc1, linc2, linc3;

    w     = decode->channels[0].width;
    h     = decode->chunk.height;
    linc0 = decode->channels[0].user_line_stride;
    linc1 = decode->channels[1].user_line_stride;
    linc2 = decode->channels[2].user_line_stride;
    linc3 = decode->channels[3].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;
    out1 = decode->channels[1].decode_to_ptr;
    out2 = decode->channels[2].decode_to_ptr;
    out3 = decode->channels[3].decode_to_ptr;

    // planar output
    for (int y = 0; y < h; ++y)
    {
        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;
        in3 = in2 + w;
        srcbuffer += w * 8; // 4 * sizeof(uint16_t), avoid type conversion
                            /* specialize to memcpy if we can */
#if EXR_HOST_IS_NOT_LITTLE_ENDIAN
        for (int x = 0; x < w; ++x)
            *(((uint16_t*) out0) + x) = one_to_native16 (in0[x]);
        for (int x = 0; x < w; ++x)
            *(((uint16_t*) out1) + x) = one_to_native16 (in1[x]);
        for (int x = 0; x < w; ++x)
            *(((uint16_t*) out2) + x) = one_to_native16 (in2[x]);
        for (int x = 0; x < w; ++x)
            *(((uint16_t*) out3) + x) = one_to_native16 (in3[x]);
#else
        memcpy (out0, in0, (size_t) (w) * sizeof (uint16_t));
        memcpy (out1, in1, (size_t) (w) * sizeof (uint16_t));
        memcpy (out2, in2, (size_t) (w) * sizeof (uint16_t));
        memcpy (out3, in3, (size_t) (w) * sizeof (uint16_t));
#endif
        out0 += linc0;
        out1 += linc1;
        out2 += linc2;
        out3 += linc3;
    }
    return EXR_ERR_SUCCESS;
}